

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O3

bool __thiscall GGWave::decode(GGWave *this,void *data,uint32_t nBytes)

{
  uchar *puVar1;
  float *pfVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t __size;
  char *__ptr;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  float factor;
  ulong local_58;
  
  if (this->m_isRxEnabled == false) {
    if ((anonymous_namespace)::g_fptr == (FILE *)0x0) {
      return false;
    }
    __ptr = "Rx is disabled - cannot receive data with this GGWave instance\n";
    __size = 0x3f;
  }
  else {
    if ((this->m_tx).hasData != true) {
      factor = this->m_sampleRateInp / this->m_sampleRate;
      iVar3 = (this->m_rx).samplesNeeded;
      do {
        if (this->m_needResampling == true) {
          iVar3 = Resampler::resample(&this->m_resampler,1.0 / factor,iVar3,
                                      (this->m_rx).amplitudeResampled.m_data,(float *)0x0);
          uVar9 = (iVar3 + 4) * this->m_sampleSizeInp;
        }
        else {
          uVar9 = iVar3 * this->m_sampleSizeInp;
        }
        if (nBytes < uVar9) {
          uVar9 = nBytes;
        }
        if (uVar9 == 0) {
          return true;
        }
        if (this->m_sampleFormatInp - GGWAVE_SAMPLE_FORMAT_U8 < 4) {
          pfVar6 = (float *)(this->m_rx).amplitudeTmp.m_data;
LAB_001062d6:
          memcpy(pfVar6,data,(ulong)uVar9);
        }
        else if (this->m_sampleFormatInp == GGWAVE_SAMPLE_FORMAT_F32) {
          pfVar6 = (this->m_rx).amplitudeResampled.m_data;
          goto LAB_001062d6;
        }
        local_58 = (ulong)uVar9;
        uVar7 = (ulong)uVar9 / (ulong)(uint)this->m_sampleSizeInp;
        if (uVar9 % (uint)this->m_sampleSizeInp != 0) {
          if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
            fprintf((anonymous_namespace)::g_fptr,
                    "Failure during capture - provided bytes (%d) are not multiple of sample size (%d)\n"
                    ,(ulong)uVar9);
          }
          (this->m_rx).samplesNeeded = this->m_samplesPerFrame;
          return true;
        }
        iVar4 = (int)uVar7;
        switch(this->m_sampleFormatInp) {
        case GGWAVE_SAMPLE_FORMAT_U8:
          if (0 < iVar4) {
            puVar1 = (this->m_rx).amplitudeTmp.m_data;
            pfVar6 = (this->m_rx).amplitudeResampled.m_data;
            uVar8 = 0;
            do {
              pfVar6[uVar8] = (float)(int)(puVar1[uVar8] - 0x80) * 0.0078125;
              uVar8 = uVar8 + 1;
            } while (uVar8 < uVar7);
          }
          break;
        case GGWAVE_SAMPLE_FORMAT_I8:
          if (0 < iVar4) {
            puVar1 = (this->m_rx).amplitudeTmp.m_data;
            pfVar6 = (this->m_rx).amplitudeResampled.m_data;
            uVar8 = 0;
            do {
              pfVar6[uVar8] = (float)(int)(char)puVar1[uVar8] * 0.0078125;
              uVar8 = uVar8 + 1;
            } while (uVar8 < uVar7);
          }
          break;
        case GGWAVE_SAMPLE_FORMAT_U16:
          if (0 < iVar4) {
            puVar1 = (this->m_rx).amplitudeTmp.m_data;
            pfVar6 = (this->m_rx).amplitudeResampled.m_data;
            uVar8 = 0;
            do {
              pfVar6[uVar8] = (float)(int)(*(ushort *)(puVar1 + uVar8 * 2) - 0x8000) * 3.0517578e-05
              ;
              uVar8 = uVar8 + 1;
            } while (uVar8 < uVar7);
          }
          break;
        case GGWAVE_SAMPLE_FORMAT_I16:
          if (0 < iVar4) {
            puVar1 = (this->m_rx).amplitudeTmp.m_data;
            pfVar6 = (this->m_rx).amplitudeResampled.m_data;
            uVar8 = 0;
            do {
              pfVar6[uVar8] = (float)(int)*(short *)(puVar1 + uVar8 * 2) * 3.0517578e-05;
              uVar8 = uVar8 + 1;
            } while (uVar8 < uVar7);
          }
        }
        iVar3 = this->m_samplesPerFrame;
        uVar10 = iVar3 - (this->m_rx).samplesNeeded;
        if (this->m_needResampling == false) {
          if (0 < iVar4) {
            pfVar6 = (this->m_rx).amplitude.m_data;
            pfVar2 = (this->m_rx).amplitudeResampled.m_data;
            uVar8 = 0;
            do {
              pfVar6[(int)(uVar10 + (int)uVar8)] = pfVar2[uVar8];
              uVar8 = uVar8 + 1;
            } while (uVar8 < uVar7);
          }
        }
        else {
          iVar5 = iVar3;
          if (iVar4 < 0x81) {
LAB_001065a1:
            (this->m_rx).samplesNeeded = iVar5;
            return true;
          }
          if (((this->m_rx).receiving == false) &&
             (this->m_sampleRate * factor * 60.0 < (float)(this->m_resampler).m_state.nSamplesTotal)
             ) {
            (this->m_resampler).m_state.nSamplesTotal = 0;
            (this->m_resampler).m_state.timeInt = 0;
            *(undefined8 *)&(this->m_resampler).m_state.timeLast = 0;
            (this->m_resampler).m_state.timeNow = 0.0;
            memset((this->m_resampler).m_edgeSamples.m_data,0,
                   (long)(this->m_resampler).m_edgeSamples.m_size << 2);
            memset((this->m_resampler).m_delayBuffer.m_data,0,
                   (long)(this->m_resampler).m_delayBuffer.m_size << 2);
            memset((this->m_resampler).m_samplesInp.m_data,0,
                   (long)(this->m_resampler).m_samplesInp.m_size << 2);
          }
          iVar4 = Resampler::resample(&this->m_resampler,factor,iVar4,
                                      (this->m_rx).amplitudeResampled.m_data,
                                      (this->m_rx).amplitude.m_data + uVar10);
          iVar4 = iVar4 + uVar10;
          iVar3 = this->m_samplesPerFrame;
        }
        iVar5 = iVar3 - iVar4;
        if (iVar5 != 0 && iVar4 <= iVar3) goto LAB_001065a1;
        (this->m_rx).hasNewAmplitude = true;
        if (this->m_isFixedPayloadLength == true) {
          decode_fixed(this);
        }
        else {
          decode_variable(this);
        }
        iVar3 = this->m_samplesPerFrame;
        uVar10 = iVar4 - iVar3;
        if (uVar10 != 0 && iVar3 <= iVar4) {
          pfVar6 = (this->m_rx).amplitude.m_data;
          uVar7 = 0;
          do {
            pfVar6[uVar7] = pfVar6[(long)iVar3 + uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar10 != uVar7);
        }
        data = (void *)((long)data + local_58);
        nBytes = nBytes - uVar9;
        iVar3 = iVar3 - uVar10;
        (this->m_rx).samplesNeeded = iVar3;
      } while( true );
    }
    if ((anonymous_namespace)::g_fptr == (FILE *)0x0) {
      return false;
    }
    __ptr = "Cannot decode while transmitting\n";
    __size = 0x21;
  }
  fwrite(__ptr,__size,1,(anonymous_namespace)::g_fptr);
  return false;
}

Assistant:

bool GGWave::decode(const void * data, uint32_t nBytes) {
    if (m_isRxEnabled == false) {
        ggprintf("Rx is disabled - cannot receive data with this GGWave instance\n");
        return false;
    }

    if (m_tx.hasData) {
        ggprintf("Cannot decode while transmitting\n");
        return false;
    }

    auto dataBuffer = (uint8_t *) data;
    const float factor = m_sampleRateInp/m_sampleRate;

    while (true) {
        // read capture data
        uint32_t nBytesNeeded = m_rx.samplesNeeded*m_sampleSizeInp;

        if (m_needResampling) {
            // note : predict 4 extra samples just to make sure we have enough data
            nBytesNeeded = (m_resampler.resample(1.0f/factor, m_rx.samplesNeeded, m_rx.amplitudeResampled.data(), nullptr) + 4)*m_sampleSizeInp;
        }

        const uint32_t nBytesRecorded = GG_MIN(nBytes, nBytesNeeded);

        if (nBytesRecorded == 0) {
            break;
        }

        switch (m_sampleFormatInp) {
            case GGWAVE_SAMPLE_FORMAT_UNDEFINED: break;
            case GGWAVE_SAMPLE_FORMAT_U8:
            case GGWAVE_SAMPLE_FORMAT_I8:
            case GGWAVE_SAMPLE_FORMAT_U16:
            case GGWAVE_SAMPLE_FORMAT_I16:
                {
                    memcpy(m_rx.amplitudeTmp.data(), dataBuffer, nBytesRecorded);
                } break;
            case GGWAVE_SAMPLE_FORMAT_F32:
                {
                    memcpy(m_rx.amplitudeResampled.data(), dataBuffer, nBytesRecorded);
                } break;
        }

        dataBuffer += nBytesRecorded;
        nBytes -= nBytesRecorded;

        if (nBytesRecorded % m_sampleSizeInp != 0) {
            ggprintf("Failure during capture - provided bytes (%d) are not multiple of sample size (%d)\n",
                    nBytesRecorded, m_sampleSizeInp);
            m_rx.samplesNeeded = m_samplesPerFrame;
            break;
        }

        // convert to 32-bit float
        int nSamplesRecorded = nBytesRecorded/m_sampleSizeInp;
        switch (m_sampleFormatInp) {
            case GGWAVE_SAMPLE_FORMAT_UNDEFINED: break;
            case GGWAVE_SAMPLE_FORMAT_U8:
                {
                    constexpr float scale = 1.0f/128;
                    auto p = reinterpret_cast<uint8_t *>(m_rx.amplitudeTmp.data());
                    for (int i = 0; i < nSamplesRecorded; ++i) {
                        m_rx.amplitudeResampled[i] = float(int16_t(*(p + i)) - 128)*scale;
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_I8:
                {
                    constexpr float scale = 1.0f/128;
                    auto p = reinterpret_cast<int8_t *>(m_rx.amplitudeTmp.data());
                    for (int i = 0; i < nSamplesRecorded; ++i) {
                        m_rx.amplitudeResampled[i] = float(*(p + i))*scale;
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_U16:
                {
                    constexpr float scale = 1.0f/32768;
                    auto p = reinterpret_cast<uint16_t *>(m_rx.amplitudeTmp.data());
                    for (int i = 0; i < nSamplesRecorded; ++i) {
                        m_rx.amplitudeResampled[i] = float(int32_t(*(p + i)) - 32768)*scale;
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_I16:
                {
                    constexpr float scale = 1.0f/32768;
                    auto p = reinterpret_cast<int16_t *>(m_rx.amplitudeTmp.data());
                    for (int i = 0; i < nSamplesRecorded; ++i) {
                        m_rx.amplitudeResampled[i] = float(*(p + i))*scale;
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_F32: break;
        }

        uint32_t offset = m_samplesPerFrame - m_rx.samplesNeeded;

        if (m_needResampling) {
            if (nSamplesRecorded <= 2*Resampler::kWidth) {
                m_rx.samplesNeeded = m_samplesPerFrame;
                break;
            }

            // reset resampler state every minute
            if (!m_rx.receiving && m_resampler.nSamplesTotal() > 60.0f*factor*m_sampleRate) {
                m_resampler.reset();
            }

            int nSamplesResampled = offset + m_resampler.resample(factor, nSamplesRecorded, m_rx.amplitudeResampled.data(), m_rx.amplitude.data() + offset);
            nSamplesRecorded = nSamplesResampled;
        } else {
            for (int i = 0; i < nSamplesRecorded; ++i) {
                m_rx.amplitude[offset + i] = m_rx.amplitudeResampled[i];
            }
        }

        // we have enough bytes to do analysis
        if (nSamplesRecorded >= m_samplesPerFrame) {
            m_rx.hasNewAmplitude = true;

            if (m_isFixedPayloadLength) {
                decode_fixed();
            } else {
                decode_variable();
            }

            int nExtraSamples = nSamplesRecorded - m_samplesPerFrame;
            for (int i = 0; i < nExtraSamples; ++i) {
                m_rx.amplitude[i] = m_rx.amplitude[m_samplesPerFrame + i];
            }

            m_rx.samplesNeeded = m_samplesPerFrame - nExtraSamples;
        } else {
            m_rx.samplesNeeded = m_samplesPerFrame - nSamplesRecorded;
            break;
        }
    }

    return true;
}